

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::SetScissorRects
          (DeviceContextVkImpl *this,Uint32 NumRects,Rect *pRects,Uint32 RTWidth,Uint32 RTHeight)

{
  bool bVar1;
  PipelineStateVkImpl *pPVar2;
  PipelineStateDesc *this_00;
  GraphicsPipelineDesc *pGVar3;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  Uint32 RTHeight_local;
  Uint32 RTWidth_local;
  Rect *pRects_local;
  Uint32 NumRects_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_4_ = RTHeight;
  msg.field_2._12_4_ = RTWidth;
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetScissorRects
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,NumRects,pRects,
             (Uint32 *)(msg.field_2._M_local_buf + 0xc),(Uint32 *)(msg.field_2._M_local_buf + 8));
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  if (bVar1) {
    pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    this_00 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                        (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline(this_00);
    if (bVar1) {
      pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
      pGVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                         (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      if (((pGVar3->RasterizerDesc).ScissorEnable & 1U) != 0) {
        if (NumRects !=
            (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects) {
          FormatString<char[35]>
                    ((string *)local_48,(char (*) [35])"Unexpected number of scissor rects");
          Message = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (Message,"SetScissorRects",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x6f2);
          std::__cxx11::string::~string((string *)local_48);
        }
        CommitScissorRects(this);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetScissorRects(Uint32 NumRects, const Rect* pRects, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetScissorRects(NumRects, pRects, RTWidth, RTHeight);

    // Only commit scissor rects if scissor test is enabled in the rasterizer state.
    // If scissor is currently disabled, or no PSO is bound, scissor rects will be committed by
    // the SetPipelineState() when a PSO with enabled scissor test is set.
    if (m_pPipelineState && m_pPipelineState->GetDesc().IsAnyGraphicsPipeline() && m_pPipelineState->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable)
    {
        VERIFY(NumRects == m_NumScissorRects, "Unexpected number of scissor rects");
        CommitScissorRects();
    }
}